

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::beta_dist<long_double>::cdf(beta_dist<long_double> *this,result_type_conflict3 x)

{
  param_type *in_RSI;
  result_type_conflict3 *in_RDI;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  longdouble in_stack_00000008;
  undefined8 in_stack_ffffffffffffff92;
  undefined6 uVar1;
  undefined2 in_stack_ffffffffffffffa6;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 in_stack_ffffffffffffffb2;
  undefined6 uVar4;
  undefined2 uVar5;
  
  uVar5 = SUB102(in_stack_00000008,0);
  if (((longdouble)0 < in_stack_00000008) && (in_stack_00000008 < (longdouble)1)) {
    uVar4 = SUB106(in_stack_00000008,0);
    param_type::alpha(in_RDI,in_RSI);
    uVar2 = (undefined2)in_ST0;
    uVar3 = (undefined2)((unkuint10)in_ST0 >> 0x40);
    param_type::beta(in_RDI,in_RSI);
    uVar1 = (undefined6)((unkuint10)in_ST1 >> 0x20);
    param_type::norm(in_RDI,in_RSI);
    in_RDI = (result_type_conflict3 *)
             math::Beta_I((longdouble)CONCAT28(uVar5,in_RDI),
                          (longdouble)CONCAT64(uVar4,CONCAT22(in_stack_ffffffffffffffb2,uVar3)),
                          (longdouble)CONCAT28(uVar2,CONCAT26(in_stack_ffffffffffffffa6,uVar1)),
                          (longdouble)
                          CONCAT82(in_stack_ffffffffffffff92,(short)((unkuint10)in_ST2 >> 0x40)));
  }
  return in_RDI;
}

Assistant:

cdf(result_type x) const {
      if (x <= 0)
        return 0;
      if (x >= 1)
        return 1;
      return math::Beta_I(x, P.alpha(), P.beta(), P.norm());
    }